

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

int cram_huffman_encode_char(cram_slice *slice,cram_codec *c,char *in,int in_size)

{
  int iVar1;
  cram_encoding cVar2;
  uint uVar3;
  byte *pbStack_48;
  int sym;
  uchar *syms;
  int local_38;
  int r;
  int len;
  int code;
  int i;
  int in_size_local;
  char *in_local;
  cram_codec *c_local;
  cram_slice *slice_local;
  
  syms._4_4_ = 0;
  pbStack_48 = (byte *)in;
  code = in_size;
  do {
    cVar2 = (cram_encoding)*pbStack_48;
    if (((int)cVar2 < -1) || (0x7f < cVar2)) {
      len = 0;
      while ((len < (c->field_6).e_huffman.nvals &&
             ((&((c->field_6).byte_array_len.len_codec)->codec)[(long)len * 4] != cVar2))) {
        len = len + 1;
      }
      if (len == (c->field_6).e_huffman.nvals) {
        return -1;
      }
      r = *(int *)(&((c->field_6).byte_array_len.len_codec)->out + (long)len * 2);
      local_38 = *(int *)((long)&((c->field_6).byte_array_len.len_codec)->out + (long)len * 0x10 + 4
                         );
    }
    else {
      iVar1 = *(int *)((long)&c->field_6 + (long)(int)(cVar2 + E_EXTERNAL) * 4 + 0xc);
      if ((&((c->field_6).byte_array_len.len_codec)->codec)[(long)iVar1 * 4] != cVar2) {
        __assert_fail("c->e_huffman.codes[i].symbol == sym",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_codecs.c"
                      ,0x437,"int cram_huffman_encode_char(cram_slice *, cram_codec *, char *, int)"
                     );
      }
      r = *(int *)(&((c->field_6).byte_array_len.len_codec)->out + (long)iVar1 * 2);
      local_38 = *(int *)((long)&((c->field_6).byte_array_len.len_codec)->out +
                         (long)iVar1 * 0x10 + 4);
    }
    uVar3 = store_bits_MSB(c->out,r,local_38);
    syms._4_4_ = uVar3 | syms._4_4_;
    code = code + -1;
    pbStack_48 = pbStack_48 + 1;
    if (code == 0) {
      return syms._4_4_;
    }
  } while( true );
}

Assistant:

int cram_huffman_encode_char(cram_slice *slice, cram_codec *c,
			     char *in, int in_size) {
    int i, code, len, r = 0;
    unsigned char *syms = (unsigned char *)in;

    do {
	int sym = *syms++;
	if (sym >= -1 && sym < MAX_HUFF) {
	    i = c->e_huffman.val2code[sym+1];
	    assert(c->e_huffman.codes[i].symbol == sym);
	    code = c->e_huffman.codes[i].code;
	    len  = c->e_huffman.codes[i].len;
	} else {
	    /* Slow - use a lookup table for when sym < MAX_HUFF? */
	    for (i = 0; i < c->e_huffman.nvals; i++) {
		if (c->e_huffman.codes[i].symbol == sym)
		    break;
	    }
	    if (i == c->e_huffman.nvals)
		return -1;
    
	    code = c->e_huffman.codes[i].code;
	    len  = c->e_huffman.codes[i].len;
	}

	r |= store_bits_MSB(c->out, code, len);
    } while (--in_size);

    return r;
}